

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O2

void nmq_update(NMQ *q,uint32_t current)

{
  uint uVar1;
  
  if (q->inited != '\x01') {
    __assert_fail("q->inited == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iceonsun[P]nmq/nmq.c",
                  0x12a,"void nmq_update(NMQ *, uint32_t)");
  }
  uVar1 = current - q->current;
  if ((uVar1 < 0x2711) && (uVar1 < q->flush_interval)) {
    return;
  }
  q->current = current;
  flush(q);
  return;
}

Assistant:

void nmq_update(NMQ *q, uint32_t current) {
    assert(q->inited == 1);

    int32_t df = current - q->current;  // df cannot < 0
    if (df > 10000 || df < 0) {
        df = q->flush_interval;
    }
    if (df >= q->flush_interval) {
        q->current = current;
        flush(q);
    }
}